

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall wasm::Asyncify::addGlobals(Asyncify *this,Module *module,bool imported)

{
  Type x;
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Const *pCVar4;
  undefined3 in_register_00000011;
  Builder local_60;
  Builder builder;
  _Head_base<0UL,_wasm::Global_*,_false> local_40;
  __single_object glob;
  __single_object glob_1;
  
  pcVar1 = DAT_00da77d0;
  builder.wasm = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
  local_60.wasm = module;
  pCVar4 = Builder::makeConst<int>(&local_60,0);
  local_40._M_head_impl = (Global *)operator_new(0x50);
  *(undefined8 *)&((local_40._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
  ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
  ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
  ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  ((local_40._M_head_impl)->type).id = 0;
  (local_40._M_head_impl)->init = (Expression *)0x0;
  *(undefined8 *)&(local_40._M_head_impl)->mutable_ = 0;
  *(Module **)&((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str =
       builder.wasm;
  *(char **)((long)&((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str +
            8) = pcVar1;
  ((local_40._M_head_impl)->type).id = 2;
  (local_40._M_head_impl)->init = (Expression *)pCVar4;
  (local_40._M_head_impl)->mutable_ = true;
  pcVar1 = DAT_00da8600;
  builder.wasm._0_4_ = CONCAT31(in_register_00000011,imported);
  if (CONCAT31(in_register_00000011,imported) != 0) {
    ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_len = ENV;
    ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar1;
    pcVar1 = DAT_00da77d0;
    ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         (size_t)wasm::(anonymous_namespace)::ASYNCIFY_STATE;
    ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar1;
  }
  Module::addGlobal(module,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_40
                   );
  uVar3 = DAT_00da77f0;
  uVar2 = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
  x.id = (this->pointerType).id;
  pCVar4 = Builder::makeConst<wasm::Type>(&local_60,x);
  glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
       operator_new(0x50);
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = uVar2;
  *(undefined8 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 8) = uVar3;
  *(uintptr_t *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = x.id;
  *(Const **)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40) = pCVar4;
  *(undefined1 *)
   ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) = 1;
  pcVar1 = DAT_00da8600;
  if ((char)builder.wasm != '\0') {
    *(size_t *)
     ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x18) = ENV;
    *(char **)((long)glob._M_t.
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20) = pcVar1;
    uVar2 = DAT_00da77f0;
    *(undefined8 *)
     ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x28) =
         wasm::(anonymous_namespace)::ASYNCIFY_DATA;
    *(undefined8 *)
     ((long)glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x30) = uVar2;
  }
  Module::addGlobal(module,&glob);
  if ((__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)
      glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0) {
    operator_delete((void *)glob._M_t.
                            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,0x50);
  }
  if (local_40._M_head_impl != (Global *)0x0) {
    operator_delete(local_40._M_head_impl,0x50);
  }
  return;
}

Assistant:

void addGlobals(Module* module, bool imported) {
    Builder builder(*module);

    auto asyncifyState = builder.makeGlobal(ASYNCIFY_STATE,
                                            Type::i32,
                                            builder.makeConst(int32_t(0)),
                                            Builder::Mutable);
    if (imported) {
      asyncifyState->module = ENV;
      asyncifyState->base = ASYNCIFY_STATE;
    }
    module->addGlobal(std::move(asyncifyState));

    auto asyncifyData = builder.makeGlobal(ASYNCIFY_DATA,
                                           pointerType,
                                           builder.makeConst(pointerType),
                                           Builder::Mutable);
    if (imported) {
      asyncifyData->module = ENV;
      asyncifyData->base = ASYNCIFY_DATA;
    }
    module->addGlobal(std::move(asyncifyData));
  }